

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

undefined8 fmt::v8::system_error<>(int error_code,format_string<> fmt)

{
  ulong in_RCX;
  undefined4 in_register_0000003c;
  format_args args;
  
  args.field_1.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x0;
  args.desc_ = in_RCX;
  vsystem_error(error_code,fmt.str_,args);
  return CONCAT44(in_register_0000003c,error_code);
}

Assistant:

auto system_error(int error_code, format_string<T...> fmt, T&&... args)
    -> std::system_error {
  return vsystem_error(error_code, fmt, fmt::make_format_args(args...));
}